

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t roaring_bitmap_serialize(roaring_bitmap_t *r,char *buf)

{
  roaring_bitmap_t *r_00;
  uint64_t uVar1;
  roaring_bitmap_t *r_01;
  undefined1 *in_RSI;
  uint64_t sizeasarray;
  uint64_t cardinality;
  size_t portablesize;
  uint32_t *in_stack_ffffffffffffffc8;
  undefined4 local_28;
  undefined1 *local_8;
  
  r_00 = (roaring_bitmap_t *)roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)0x109708);
  uVar1 = roaring_bitmap_get_cardinality(r_00);
  r_01 = (roaring_bitmap_t *)(uVar1 * 4 + 4);
  if (r_00 < r_01) {
    *in_RSI = 2;
    r_01 = (roaring_bitmap_t *)
           roaring_bitmap_portable_serialize(r_01,(char *)in_stack_ffffffffffffffc8);
  }
  else {
    *in_RSI = 1;
    local_28 = (undefined4)uVar1;
    *(undefined4 *)(in_RSI + 1) = local_28;
    roaring_bitmap_to_uint32_array(r_01,in_stack_ffffffffffffffc8);
  }
  local_8 = (undefined1 *)((long)&(r_01->high_low_container).size + 1);
  return (size_t)local_8;
}

Assistant:

size_t roaring_bitmap_serialize(const roaring_bitmap_t *r, char *buf) {
    size_t portablesize = roaring_bitmap_portable_size_in_bytes(r);
    uint64_t cardinality = roaring_bitmap_get_cardinality(r);
    uint64_t sizeasarray = cardinality * sizeof(uint32_t) + sizeof(uint32_t);
    if (portablesize < sizeasarray) {
        buf[0] = CROARING_SERIALIZATION_CONTAINER;
        return roaring_bitmap_portable_serialize(r, buf + 1) + 1;
    } else {
        buf[0] = CROARING_SERIALIZATION_ARRAY_UINT32;
        memcpy(buf + 1, &cardinality, sizeof(uint32_t));
        roaring_bitmap_to_uint32_array(
            r, (uint32_t *)(buf + 1 + sizeof(uint32_t)));
        return 1 + (size_t)sizeasarray;
    }
}